

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O3

void __thiscall
program_options::error_with_option_name::replace_token
          (error_with_option_name *this,string *from,string *to)

{
  ulong uVar1;
  pointer pcVar2;
  
  pcVar2 = (from->_M_dataplus)._M_p;
  while( true ) {
    uVar1 = std::__cxx11::string::find((char *)&this->m_message,(ulong)pcVar2,0);
    if (uVar1 == 0xffffffffffffffff) break;
    std::__cxx11::string::replace
              ((ulong)&this->m_message,uVar1,(char *)from->_M_string_length,
               (ulong)(to->_M_dataplus)._M_p);
    pcVar2 = (from->_M_dataplus)._M_p;
  }
  return;
}

Assistant:

void error_with_option_name::replace_token(const std::string& from, const std::string& to) const
{
    for (;;)
    {
        std::size_t pos = m_message.find(from.c_str(), 0, from.length());
        // not found: all replaced
        if (pos == std::string::npos)
            return;
        m_message.replace(pos, from.length(), to);
    }
}